

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activity_tracking.hpp
# Opt level: O2

unique_ptr<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t>_>
 __thiscall
so_5::stats::activity_tracking_stuff::
create_appropriate_disp<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t,so_5::disp::prio_one_thread::strictly_ordered::impl::dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>>,so_5::disp::prio_one_thread::strictly_ordered::impl::dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>>,so_5::environment_t,so_5::disp::prio_one_thread::strictly_ordered::disp_params_t,so_5::disp::prio_one_thread::strictly_ordered::disp_params_t&>
          (activity_tracking_stuff *this,environment_t *env,disp_params_t *disp_params,
          disp_params_t *args)

{
  disp_params_t *pdVar1;
  work_thread_activity_tracking_t wVar2;
  dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>_>
  *this_00;
  disp_params_t dStack_68;
  disp_params_t local_40;
  
  *(undefined8 *)this = 0;
  wVar2 = (disp_params->
          super_work_thread_activity_tracking_flag_mixin_t<so_5::disp::prio_one_thread::strictly_ordered::disp_params_t>
          ).m_flag;
  if (wVar2 == unspecified) {
    wVar2 = environment_t::work_thread_activity_tracking(env);
  }
  if (wVar2 == on) {
    this_00 = (dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>_>
               *)operator_new(0x260);
    so_5::disp::prio_one_thread::strictly_ordered::disp_params_t::disp_params_t(&local_40,args);
    so_5::disp::prio_one_thread::strictly_ordered::impl::
    dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>_>
    ::dispatcher_template_t(this_00,&local_40);
    pdVar1 = &local_40;
  }
  else {
    this_00 = (dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>_>
               *)operator_new(0x210);
    so_5::disp::prio_one_thread::strictly_ordered::disp_params_t::disp_params_t(&dStack_68,args);
    so_5::disp::prio_one_thread::strictly_ordered::impl::
    dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>_>
    ::dispatcher_template_t
              ((dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>_>
                *)this_00,&dStack_68);
    pdVar1 = &dStack_68;
  }
  *(dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>_>
    **)this = this_00;
  std::_Function_base::~_Function_base((_Function_base *)&pdVar1->m_queue_params);
  return (__uniq_ptr_data<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t>,_true,_true>
          )(__uniq_ptr_data<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr< COMMON_DISP_IFACE_TYPE >
create_appropriate_disp(
	ENV & env,
	const DISP_PARAMS & disp_params,
	ARGS && ...args )
	{
		std::unique_ptr< COMMON_DISP_IFACE_TYPE > disp;

		auto tracking = disp_params.work_thread_activity_tracking();
		if( work_thread_activity_tracking_t::unspecified == tracking )
			tracking = env.work_thread_activity_tracking();

		if( work_thread_activity_tracking_t::on == tracking )
			disp.reset(
				new DISP_WITH_TRACKING{ std::forward<ARGS>(args)... } );
		else
			disp.reset(
				new DISP_NO_TRACKING{ std::forward<ARGS>(args)... } );

		return disp;
	}